

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O3

void __thiscall cmCTestScriptHandler::UpdateElapsedTime(cmCTestScriptHandler *this)

{
  cmMakefile *this_00;
  bool bVar1;
  char cVar2;
  char cVar3;
  uint __val;
  long lVar4;
  uint uVar5;
  string timeString;
  cmDuration local_60;
  uint local_58;
  long local_50 [2];
  string local_40;
  
  if (this->Makefile != (cmMakefile *)0x0) {
    lVar4 = std::chrono::_V2::steady_clock::now();
    local_60.__r = (double)(lVar4 - (this->ScriptStartTime).__d.__r) / 1000000000.0;
    __val = cmDurationTo<unsigned_int>(&local_60);
    cVar3 = '\x01';
    if (9 < __val) {
      uVar5 = __val;
      cVar2 = '\x04';
      do {
        cVar3 = cVar2;
        if (uVar5 < 100) {
          cVar3 = cVar3 + -2;
          goto LAB_00197688;
        }
        if (uVar5 < 1000) {
          cVar3 = cVar3 + -1;
          goto LAB_00197688;
        }
        if (uVar5 < 10000) goto LAB_00197688;
        bVar1 = 99999 < uVar5;
        uVar5 = uVar5 / 10000;
        cVar2 = cVar3 + '\x04';
      } while (bVar1);
      cVar3 = cVar3 + '\x01';
    }
LAB_00197688:
    local_60.__r = (rep_conflict)local_50;
    std::__cxx11::string::_M_construct((ulong)&local_60,cVar3);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_60.__r,local_58,__val);
    this_00 = this->Makefile;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"CTEST_ELAPSED_TIME","");
    cmMakefile::AddDefinition(this_00,&local_40,(char *)local_60.__r);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_60.__r != local_50) {
      operator_delete((void *)local_60.__r,local_50[0] + 1);
    }
  }
  return;
}

Assistant:

void cmCTestScriptHandler::UpdateElapsedTime()
{
  if (this->Makefile) {
    // set the current elapsed time
    auto itime = cmDurationTo<unsigned int>(std::chrono::steady_clock::now() -
                                            this->ScriptStartTime);
    auto timeString = std::to_string(itime);
    this->Makefile->AddDefinition("CTEST_ELAPSED_TIME", timeString.c_str());
  }
}